

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O2

int io_readline(lua_State *L)

{
  int iVar1;
  undefined8 *puVar2;
  lua_Integer lVar3;
  char *pcVar4;
  int iVar5;
  
  puVar2 = (undefined8 *)lua_touserdata(L,-0xf4629);
  lVar3 = lua_tointegerx(L,-0xf462a,(int *)0x0);
  if (puVar2[1] == 0) {
    iVar1 = luaL_error(L,"file is already closed");
    return iVar1;
  }
  lua_settop(L,1);
  iVar5 = (int)lVar3;
  luaL_checkstack(L,iVar5,"too many arguments");
  iVar1 = 0;
  if (0 < iVar5) {
    iVar1 = iVar5;
  }
  for (iVar5 = -0xf462c; iVar1 + iVar5 != -0xf462c; iVar5 = iVar5 + -1) {
    lua_pushvalue(L,iVar5);
  }
  iVar1 = g_read(L,(FILE *)*puVar2,2);
  iVar5 = lua_toboolean(L,-iVar1);
  if (iVar5 == 0) {
    if (1 < iVar1) {
      pcVar4 = lua_tolstring(L,1 - iVar1,(size_t *)0x0);
      iVar1 = luaL_error(L,"%s",pcVar4);
      return iVar1;
    }
    iVar5 = lua_toboolean(L,-0xf462b);
    iVar1 = 0;
    if (iVar5 != 0) {
      lua_settop(L,0);
      lua_pushvalue(L,-0xf4629);
      aux_close(L);
    }
  }
  return iVar1;
}

Assistant:

static int io_readline(lua_State *L) {
    LStream *p = (LStream *) lua_touserdata(L, lua_upvalueindex(1));
    int i;
    int n = (int) lua_tointeger(L, lua_upvalueindex(2));
    if (isclosed(p))  /* file is already closed? */
        return luaL_error(L, "file is already closed");
    lua_settop(L, 1);
    luaL_checkstack(L, n, "too many arguments");
    for (i = 1; i <= n; i++)  /* push arguments to 'g_read' */
        lua_pushvalue(L, lua_upvalueindex(3 + i));
    n = g_read(L, p->f, 2);  /* 'n' is number of results */
    lua_assert(n > 0);  /* should return at least a nil */
    if (lua_toboolean(L, -n))  /* read at least one value? */
        return n;  /* return them */
    else {  /* first result is nil: EOF or error */
        if (n > 1) {  /* is there error information? */
            /* 2nd result is error message */
            return luaL_error(L, "%s", lua_tostring(L, -n + 1));
        }
        if (lua_toboolean(L, lua_upvalueindex(3))) {  /* generator created file? */
            lua_settop(L, 0);
            lua_pushvalue(L, lua_upvalueindex(1));
            aux_close(L);  /* close it */
        }
        return 0;
    }
}